

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void PDHG_Dump_Stats(CUPDLPwork *w)

{
  long lVar1;
  long in_RDI;
  double dVar2;
  double dVar3;
  CUPDLPstepsize *stepsize;
  CUPDLPiterates *iterates;
  cupdlp_int nRows;
  cupdlp_int nCols;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  printf("------------------------------------------------\n");
  printf("Iteration % 3d\n",(ulong)**(uint **)(in_RDI + 0x30));
  printf("PrimalStep: %e, SumPrimalStep: %e, DualStep: %e, SumDualStep: %e\n",
         *(undefined8 *)(lVar1 + 8),*(undefined8 *)(lVar1 + 0x18),*(undefined8 *)(lVar1 + 0x10),
         *(undefined8 *)(lVar1 + 0x20));
  dVar2 = sqrt(*(double *)(lVar1 + 8) * *(double *)(lVar1 + 0x10));
  dVar3 = sqrt(*(double *)(lVar1 + 0x28));
  printf("Stepsize: %e, Primal weight: %e Ratio: %e\n",dVar2,dVar3,*(undefined8 *)(lVar1 + 0x30));
  return;
}

Assistant:

void PDHG_Dump_Stats(CUPDLPwork *w) {
  cupdlp_int nCols = w->iterates->nCols;
  cupdlp_int nRows = w->iterates->nRows;
  CUPDLPiterates *iterates = w->iterates;
  CUPDLPstepsize *stepsize = w->stepsize;

  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("Iteration % 3d\n", w->timers->nIter);
#if CUPDLP_DUMP_ITERATES
  cupdlp_int iter = w->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  vecPrint("x", x->data, nCols);
  vecPrint("y", y->data, nRows);
  vecPrint("xSum", iterates->xSum, nCols);
  vecPrint("ySum", iterates->ySum, nRows);
  vecPrint("Ax ", ax->data, nRows);
  vecPrint("A'y", aty->data, nCols);
  vecPrint("xLastRestart", iterates->xLastRestart, nCols);
  vecPrint("yLastRestart", iterates->yLastRestart, nRows);
#endif
  cupdlp_printf(
      "PrimalStep: %e, SumPrimalStep: %e, DualStep: %e, SumDualStep: %e\n",
      stepsize->dPrimalStep, stepsize->dSumPrimalStep, stepsize->dDualStep,
      stepsize->dSumDualStep);
  cupdlp_printf("Stepsize: %e, Primal weight: %e Ratio: %e\n",
                sqrt(stepsize->dPrimalStep * stepsize->dDualStep),
                sqrt(stepsize->dBeta), stepsize->dTheta);
}